

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task28.cpp
# Opt level: O1

bool is_sort(int *arr,int len,Order type)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  
  bVar1 = len < 2;
  if (type == DESC) {
    if (len < 2) {
      return bVar1;
    }
    if (*arr < arr[1]) {
      return bVar1;
    }
    uVar2 = 2;
    do {
      uVar3 = uVar2;
      if ((uint)len == uVar3) break;
      uVar2 = uVar3 + 1;
    } while (arr[uVar3] <= arr[uVar3 - 1]);
  }
  else {
    if (len < 2) {
      return bVar1;
    }
    if (arr[1] < *arr) {
      return bVar1;
    }
    uVar2 = 2;
    do {
      uVar3 = uVar2;
      if ((uint)len == uVar3) break;
      uVar2 = uVar3 + 1;
    } while (arr[uVar3 - 1] <= arr[uVar3]);
  }
  return (uint)len <= uVar3;
}

Assistant:

bool is_sort(int* arr, int len, Order type){
    switch (type) {
        case DESC:
            for (int i = 1; i < len; i++) {
                if (arr[i - 1] < arr[i]) {
                    return false;
                }
            }
            return true;
        case ABC:
            for (int i = 1; i < len; i++) {
                if (arr[i - 1] > arr[i]) {
                    return false;
                }
            }
            return true;
    }
}